

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void count_categs(size_t *ix_arr,size_t st,size_t end,int *x,int ncat,size_t *counts)

{
  size_t row;
  
  if (ncat != 0) {
    memset(counts,0,(long)ncat << 3);
  }
  for (; st <= end; st = st + 1) {
    if (-1 < (long)x[ix_arr[st]]) {
      counts[x[ix_arr[st]]] = counts[x[ix_arr[st]]] + 1;
    }
  }
  return;
}

Assistant:

void count_categs(size_t *restrict ix_arr, size_t st, size_t end, int x[], int ncat, size_t *restrict counts)
{
    std::fill(counts, counts + ncat, (size_t)0);
    for (size_t row = st; row <= end; row++)
        if (likely(x[ix_arr[row]] >= 0))
            counts[x[ix_arr[row]]]++;
}